

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfacet.hpp
# Opt level: O0

vec3f schuttejoe::GgxVndf(vec3f wo,float roughness,float u1,float u2)

{
  undefined8 uVar1;
  float fVar2;
  undefined8 in_XMM0_Qa;
  vec3f *a_00;
  double dVar3;
  double dVar4;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  vec3f vVar5;
  vec3f n;
  float p2;
  float p1;
  float phi;
  float r;
  float a;
  vec3f t2;
  vec3f t1;
  vec3f v;
  float ttt;
  vec3f *in_stack_fffffffffffffe10;
  float in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  float fVar6;
  vec3f *in_stack_fffffffffffffe20;
  float local_1c4;
  vec3f local_18c;
  vec3f local_180;
  vec3f local_170;
  undefined8 local_160;
  float local_158;
  vec3f local_150;
  vec3f local_140;
  undefined8 local_130;
  float local_128;
  vec3f local_120;
  undefined8 local_110;
  float local_108;
  undefined8 local_100;
  float local_f8;
  undefined8 local_f0;
  float local_e8;
  float local_e4;
  float local_e0;
  float local_dc;
  float local_d8;
  float local_d4;
  vec3f local_d0;
  undefined8 local_bc;
  float local_b4;
  vec3f local_b0;
  vec3f local_a0;
  vec3f local_8c;
  undefined8 local_80;
  float local_78;
  vec3f local_74;
  vec3f local_68;
  vec3f local_54;
  undefined8 local_48;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_1c;
  float fStack_18;
  float local_14;
  
  local_3c = 1.0;
  local_14 = in_XMM1_Da;
  if (in_XMM1_Da < 0.0) {
    local_14 = -in_XMM1_Da;
    local_3c = -1.0;
  }
  local_1c = (float)in_XMM0_Qa;
  fStack_18 = (float)((ulong)in_XMM0_Qa >> 0x20);
  local_38 = in_XMM4_Da;
  local_34 = in_XMM3_Da;
  local_30 = in_XMM2_Da;
  vec3f::vec3f(&local_54,local_1c * in_XMM2_Da,fStack_18 * in_XMM2_Da,local_14);
  vVar5 = normalized(in_stack_fffffffffffffe20);
  local_68._0_8_ = vVar5._0_8_;
  local_48._0_4_ = local_68.x;
  local_48._4_4_ = local_68.y;
  uVar1 = local_48;
  local_68.z = vVar5.z;
  local_40 = local_68.z;
  local_48._4_4_ = vVar5.y;
  local_68 = vVar5;
  local_48 = uVar1;
  if (0.999 <= local_48._4_4_) {
    vec3f::vec3f(&local_74,1.0,0.0,0.0);
  }
  else {
    vec3f::vec3f(&local_8c,0.0,1.0,0.0);
    vVar5 = cross(in_stack_fffffffffffffe20,
                  (vec3f *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
    local_a0.z = vVar5.z;
    local_78 = local_a0.z;
    local_a0._0_8_ = vVar5._0_8_;
    local_80._0_4_ = local_a0.x;
    local_80._4_4_ = local_a0.y;
    local_a0 = vVar5;
    vVar5 = normalized(in_stack_fffffffffffffe20);
    local_b0._0_8_ = vVar5._0_8_;
    local_74.x = local_b0.x;
    local_74.y = local_b0.y;
    local_b0.z = vVar5.z;
    local_74.z = local_b0.z;
    local_b0 = vVar5;
  }
  vVar5 = cross(in_stack_fffffffffffffe20,
                (vec3f *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  local_d0._0_8_ = vVar5._0_8_;
  local_bc._0_4_ = local_d0.x;
  local_bc._4_4_ = local_d0.y;
  local_d0.z = vVar5.z;
  local_b4 = local_d0.z;
  local_d4 = 1.0 / (local_40 + 1.0);
  local_d0 = vVar5;
  local_d8 = sqrtf(local_34);
  if (local_d4 <= local_38) {
    local_1c4 = ((local_38 - local_d4) / (1.0 - local_d4)) * PI + PI;
  }
  else {
    local_1c4 = (local_38 / local_d4) * PI;
  }
  local_dc = local_1c4;
  a_00 = (vec3f *)(double)local_d8;
  dVar3 = cos((double)local_1c4);
  local_e0 = (float)((double)a_00 * dVar3);
  dVar3 = (double)local_d8;
  dVar4 = sin((double)local_dc);
  fVar6 = local_40;
  if (local_38 < local_d4) {
    fVar6 = 1.0;
  }
  local_e4 = (float)(dVar3 * dVar4 * (double)fVar6);
  vVar5 = ::operator*(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  local_120.z = vVar5.z;
  local_108 = local_120.z;
  local_120._0_8_ = vVar5._0_8_;
  local_110._0_4_ = local_120.x;
  local_110._4_4_ = local_120.y;
  local_120 = vVar5;
  vVar5 = ::operator*(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  local_140.z = vVar5.z;
  local_128 = local_140.z;
  local_140._0_8_ = vVar5._0_8_;
  local_130._0_4_ = local_140.x;
  local_130._4_4_ = local_140.y;
  local_140 = vVar5;
  vVar5 = ::operator+(a_00,(vec3f *)CONCAT44(fVar6,in_stack_fffffffffffffe18));
  local_150.z = vVar5.z;
  local_f8 = local_150.z;
  local_150._0_8_ = vVar5._0_8_;
  local_100._0_4_ = local_150.x;
  local_100._4_4_ = local_150.y;
  fVar2 = (1.0 - local_e0 * local_e0) - local_e4 * local_e4;
  if (fVar2 <= 0.0) {
    fVar2 = 0.0;
  }
  local_150 = vVar5;
  sqrtf(fVar2);
  vVar5 = ::operator*(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
  local_170.z = vVar5.z;
  local_158 = local_170.z;
  local_170._0_8_ = vVar5._0_8_;
  local_160._0_4_ = local_170.x;
  local_160._4_4_ = local_170.y;
  local_170 = vVar5;
  vVar5 = ::operator+(a_00,(vec3f *)CONCAT44(fVar6,in_stack_fffffffffffffe18));
  local_180.z = vVar5.z;
  local_e8 = local_180.z;
  local_180._0_8_ = vVar5._0_8_;
  local_f0._0_4_ = local_180.x;
  local_f0._4_4_ = local_180.y;
  uVar1 = local_f0;
  local_f0._0_4_ = vVar5.x;
  local_f0._4_4_ = vVar5.y;
  fVar2 = local_30 * (float)local_f0;
  local_30 = local_30 * local_f0._4_4_;
  fVar6 = local_180.z;
  if (local_180.z <= 0.0) {
    fVar6 = 0.0;
  }
  local_180 = vVar5;
  local_f0 = uVar1;
  vec3f::vec3f(&local_18c,fVar2,local_30,fVar6 * local_3c);
  vVar5 = normalized(a_00);
  return vVar5;
}

Assistant:

vec3f GgxVndf(vec3f wo, float roughness, float u1, float u2)
{
    float ttt = 1;
    if (wo.z < 0) {
        wo.z = -wo.z;
        ttt = -1;
    }
    // -- Stretch the view vector so we are sampling as though
    // -- roughness==1
    vec3f v = normalized(vec3f(wo.x * roughness,
                                wo.y * roughness,
                                wo.z ));

    // -- Build an orthonormal basis with v, t1, and t2
    vec3f t1 = (v.y < 0.999f) ? normalized(cross(v, vec3f(0,1,0))) : vec3f(1,0,0);
    vec3f t2 = cross(t1, v);

    // -- Choose a point on a disk with each half of the disk weighted
    // -- proportionally to its projection onto direction v
    float a = 1.0f / (1.0f + v.z);
    float r = sqrtf(u1);
    float phi = (u2 < a) ? (u2 / a) * PI 
                         : PI + (u2 - a) / (1.0f - a) * PI;
    float p1 = r * cos(phi);
    float p2 = r * sin(phi) * ((u2 < a) ? 1.0f : v.z);

    // -- Calculate the normal in this stretched tangent space
    vec3f n = p1 * t1 + p2 * t2
             + sqrtf(fmax(0.0f, 1.0f - p1 * p1 - p2 * p2)) * v;

    // -- unstretch and normalize the normal
    return normalized(vec3f(roughness * n.x,
                            roughness * n.y,
                            fmax(0.0f, n.z) * ttt));
}